

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false,false,true>>>
::_reduce_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false,false,true>>>
          *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary,
          Dimension dim)

{
  int iVar1;
  Dimension dimension;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Index columnIndex;
  size_type sVar5;
  Column *pCVar6;
  reference pvVar7;
  int local_108;
  Index local_e0;
  Index currentIndex;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_b0;
  anon_class_8_1_5062c494 local_a8;
  anon_class_8_1_5062c494 get_last;
  undefined1 local_98 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> chainsInH;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_78;
  uint *local_70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  undefined1 local_60 [8];
  Tmp_column column;
  Dimension dim_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *boundary_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,false,false,false,false,true>>>
  *pCStack_18;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
  *this_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *chainsInF;
  
  column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = dim;
  boundary_local._4_4_ = cellID;
  pCStack_18 = this;
  this_local = (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                *)__return_storage_ptr__;
  local_68._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(boundary);
  local_70 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(boundary);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)local_60,
             local_68,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       )local_70);
  iVar1 = column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
  iVar3 = Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>
          ::get_null_value<int>();
  if (iVar1 == iVar3) {
    local_78._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(boundary);
    chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(boundary);
    bVar2 = __gnu_cxx::operator==
                      (&local_78,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&chainsInH.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      local_108 = 0;
    }
    else {
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(boundary);
      local_108 = (int)sVar5 + -1;
    }
    column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = local_108;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  get_last.column._7_1_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  local_a8.column = (Tmp_column *)local_60;
  local_b0._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(boundary);
  local_b8._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(boundary);
  bVar2 = __gnu_cxx::operator==(&local_b0,&local_b8);
  if (bVar2) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_60
               ,(value_type_conflict1 *)((long)&boundary_local + 4));
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
    ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                     *)this,(Tmp_column *)local_60,
                    column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
  }
  else {
    uVar4 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
            ::_reduce_boundary<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            anon_class_8_1_5062c494::operator()(&local_a8);
    local_e0 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
               ::get_column_with_pivot
                         ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                           *)this,uVar4);
    while( true ) {
      pCVar6 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
               ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                             *)this,local_e0);
      bVar2 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
              ::is_paired(&pCVar6->super_Chain_column_option);
      if (!bVar2) break;
      Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
      ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                      *)this,(Tmp_column *)local_60,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,local_e0);
      bVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_60);
      if (bVar2) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
        ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                         *)this,boundary_local._4_4_,(Tmp_column *)local_60,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
        ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                         *)this,(Tmp_column *)local_60,
                        column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        goto LAB_0013b83f;
      }
      uVar4 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
              ::_reduce_boundary<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              anon_class_8_1_5062c494::operator()(&local_a8);
      local_e0 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                 ::get_column_with_pivot
                           ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                             *)this,uVar4);
    }
    while (bVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   empty((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_60), ((bVar2 ^ 0xffU) & 1) != 0) {
      uVar4 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
              ::_reduce_boundary<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              anon_class_8_1_5062c494::operator()(&local_a8);
      columnIndex = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                    ::get_column_with_pivot
                              ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                                *)this,uVar4);
      pCVar6 = Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
               ::get_column((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                             *)this,columnIndex);
      bVar2 = Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
              ::is_paired(&pCVar6->super_Chain_column_option);
      if (bVar2) {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
        ::_reduce_by_G((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                        *)this,(Tmp_column *)local_60,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98,columnIndex);
      }
      else {
        Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
        ::_reduce_by_F((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                        *)this,(Tmp_column *)local_60,__return_storage_ptr__,columnIndex);
      }
    }
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
    ::_update_largest_death_in_F
              ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                *)this,__return_storage_ptr__);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
    ::_build_from_H((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                     *)this,boundary_local._4_4_,(Tmp_column *)local_60,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
    dimension = column._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,0);
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
    ::_insert_chain((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false,_false,_false,_true>_>_>
                     *)this,(Tmp_column *)local_60,dimension,*pvVar7);
  }
LAB_0013b83f:
  get_last.column._7_1_ = 1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_98);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Master_matrix::Entry_representative> Chain_matrix<Master_matrix>::_reduce_boundary(
    ID_index cellID, const Boundary_range& boundary, Dimension dim)
{
  Tmp_column column(boundary.begin(), boundary.end());
  if (dim == Master_matrix::template get_null_value<Dimension>())
    dim = boundary.begin() == boundary.end() ? 0 : boundary.size() - 1;
  std::vector<Entry_representative> chainsInH;  // for corresponding indices in H (paired columns)
  std::vector<Entry_representative> chainsInF;  // for corresponding indices in F (unpaired, essential columns)

  auto get_last = [&column]() {
    if constexpr (Master_matrix::Option_list::is_z2)
      return *(column.rbegin());
    else
      return column.rbegin()->first;
  };

  if (boundary.begin() == boundary.end()) {
    if constexpr (Master_matrix::Option_list::is_z2)
      column.insert(cellID);
    else
      column.emplace(cellID, 1);
    _insert_chain(column, dim);
    return chainsInF;
  }

  Index currentIndex = get_column_with_pivot(get_last());

  while (get_column(currentIndex).is_paired()) {
    _reduce_by_G(column, chainsInH, currentIndex);

    if (column.empty()) {
      // produce the sum of all col_h in chains_in_H
      _build_from_H(cellID, column, chainsInH);
      // create a new cycle (in F) sigma - \sum col_h
      _insert_chain(column, dim);
      return chainsInF;
    }

    currentIndex = get_column_with_pivot(get_last());
  }

  while (!column.empty()) {
    currentIndex = get_column_with_pivot(get_last());

    if (!get_column(currentIndex).is_paired()) {
      // only fills currentEssentialCycleIndices if Z2 coefficients, so chainsInF remains empty
      _reduce_by_F(column, chainsInF, currentIndex);
    } else {
      _reduce_by_G(column, chainsInH, currentIndex);
    }
  }

  _update_largest_death_in_F(chainsInF);

  // Compute the new column cellID + \sum col_h, for col_h in chains_in_H
  _build_from_H(cellID, column, chainsInH);

  // Create and insert (\sum col_h) + sigma (in H, paired with chain_fp) in matrix_
  if constexpr (Master_matrix::Option_list::is_z2)
    _insert_chain(column, dim, chainsInF[0]);
  else
    _insert_chain(column, dim, chainsInF[0].first);

  return chainsInF;
}